

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_16_frc_al(void)

{
  uint addr_in;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint addr_in_00;
  uint uVar4;
  bool bVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    addr_in_00 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 4;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in_00 = pmmu_translate_addr(addr_in_00);
    }
    addr_in = m68k_read_memory_32(addr_in_00 & m68ki_cpu.address_mask);
    uVar1 = m68ki_cpu.x_flag >> 4;
    uVar2 = m68ki_cpu.n_flag >> 4;
    bVar5 = m68ki_cpu.not_z_flag == 0;
    uVar3 = m68ki_cpu.v_flag >> 6;
    uVar4 = m68ki_cpu.c_flag >> 8;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    m68k_write_memory_16
              (addr_in & m68ki_cpu.address_mask,
               uVar4 & 1 | uVar3 & 2 | (uVar2 & 8 | uVar1 & 0x10) + (uint)bVar5 * 4);
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_move_16_frc_al(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		m68ki_write_16(EA_AL_16(), m68ki_get_ccr());
		return;
	}
	m68ki_exception_illegal();
}